

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
::unchecked_insert<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
           *this,pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *x)

{
  size_t hash;
  locator lStack_28;
  
  hash = mulx_mix::mix<slang::hash<std::type_index,void>,std::type_index>
                   ((hash<std::type_index,_void> *)this,&x->first);
  unchecked_emplace_at<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>const&>
            (&lStack_28,this,hash >> ((byte)*this & 0x3f),hash,x);
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }